

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmobj.cpp
# Opt level: O1

void __thiscall
CVmObjTable::for_each(CVmObjTable *this,_func_void_vm_obj_id_t_void_ptr *func,void *ctx)

{
  CVmObjPageEntry *pCVar1;
  size_t sVar2;
  vm_obj_id_t vVar3;
  CVmObjPageEntry **ppCVar4;
  long lVar5;
  
  sVar2 = this->pages_used_;
  if (sVar2 != 0) {
    ppCVar4 = this->pages_;
    vVar3 = 0;
    do {
      pCVar1 = *ppCVar4;
      lVar5 = 0x14;
      do {
        if (((pCVar1->ptr_).obj_[lVar5] & 1U) == 0) {
          (*func)(vVar3,ctx);
        }
        vVar3 = vVar3 + 1;
        lVar5 = lVar5 + 0x18;
      } while (lVar5 != 0x18014);
      ppCVar4 = ppCVar4 + 1;
      sVar2 = sVar2 - 1;
    } while (sVar2 != 0);
  }
  return;
}

Assistant:

void CVmObjTable::for_each(VMG_ void (*func)(VMG_ vm_obj_id_t, void *),
                           void *ctx)
{
    CVmObjPageEntry **pg;
    size_t i;
    vm_obj_id_t id;

    /* go through each page in the object table */
    for (id = 0, i = pages_used_, pg = pages_ ; i > 0 ; ++pg, --i)
    {
        /* start at the start of the page */
        size_t j = VM_OBJ_PAGE_CNT;
        CVmObjPageEntry *entry = *pg;

        /* go through each entry on this page */
        for ( ; j > 0 ; --j, ++entry, ++id)
        {
            /* if this entry is in use, invoke the callback */
            if (!entry->free_)
                (*func)(vmg_ id, ctx);
        }
    }
}